

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::UnHex(int c)

{
  ostream *poVar1;
  ostream *this;
  LogMessage local_190;
  int local_10;
  int local_c;
  int c_local;
  
  if ((c < 0x30) || (0x39 < c)) {
    if ((c < 0x41) || (0x46 < c)) {
      if ((c < 0x61) || (0x66 < c)) {
        local_10 = c;
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/parse.cc"
                   ,0x5a6);
        poVar1 = LogMessage::stream(&local_190);
        this = std::operator<<((ostream *)poVar1,"Bad hex digit ");
        std::ostream::operator<<(this,local_10);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
      }
      local_c = c + -0x57;
    }
    else {
      local_c = c + -0x37;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static int UnHex(int c) {
  if ('0' <= c && c <= '9')
    return c - '0';
  if ('A' <= c && c <= 'F')
    return c - 'A' + 10;
  if ('a' <= c && c <= 'f')
    return c - 'a' + 10;
  LOG(DFATAL) << "Bad hex digit " << c;
  return 0;
}